

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int luv_udp_bind(lua_State *L)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uv_udp_t *handle;
  char *ip;
  ulong uVar4;
  int in_ESI;
  uint uVar5;
  sockaddr_storage addr;
  
  handle = luv_check_udp(L,in_ESI);
  uVar5 = 0;
  ip = luaL_checklstring(L,2,(size_t *)0x0);
  iVar2 = 3;
  uVar4 = luaL_checkinteger(L,3);
  iVar1 = uv_ip4_addr(ip,(int)uVar4,(sockaddr_in *)&addr);
  if ((iVar1 != 0) && (iVar1 = uv_ip6_addr(ip,(int)uVar4,(sockaddr_in6 *)&addr), iVar1 != 0)) {
    iVar2 = luaL_error(L,"Invalid IP address or port [%s:%d]",ip,uVar4 & 0xffffffff);
    return iVar2;
  }
  iVar1 = lua_type(L,4);
  if (iVar1 == 5) {
    luaL_checktype(L,4,5);
    lua_getfield(L,4,"reuseaddr");
    iVar1 = lua_toboolean(L,-1);
    lua_settop(L,-2);
    lua_getfield(L,4,"ipv6only");
    iVar3 = lua_toboolean(L,-1);
    uVar5 = (uint)(iVar3 != 0) + (uint)(iVar1 != 0) * 4;
    lua_settop(L,-2);
  }
  uVar5 = uv_udp_bind(handle,(sockaddr *)&addr,uVar5);
  if ((int)uVar5 < 0) {
    luv_error(L,uVar5);
  }
  else {
    lua_pushinteger(L,(ulong)uVar5);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int luv_udp_bind(lua_State* L) {
  uv_udp_t* handle = luv_check_udp(L, 1);
  const char* host = luaL_checkstring(L, 2);
  int port = luaL_checkinteger(L, 3);
  unsigned int flags = 0;
  struct sockaddr_storage addr;
  int ret;
  if (uv_ip4_addr(host, port, (struct sockaddr_in*)&addr) &&
      uv_ip6_addr(host, port, (struct sockaddr_in6*)&addr)) {
    return luaL_error(L, "Invalid IP address or port [%s:%d]", host, port);
  }
  if (lua_type(L, 4) == LUA_TTABLE) {
    luaL_checktype(L, 4, LUA_TTABLE);
    lua_getfield(L, 4, "reuseaddr");
    if (lua_toboolean(L, -1)) flags |= UV_UDP_REUSEADDR;
    lua_pop(L, 1);
    lua_getfield(L, 4, "ipv6only");
    if (lua_toboolean(L, -1)) flags |= UV_UDP_IPV6ONLY;
    lua_pop(L, 1);
  }
  ret = uv_udp_bind(handle, (struct sockaddr*)&addr, flags);
  return luv_result(L, ret);
}